

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Face.cpp
# Opt level: O3

vector<Color,_std::allocator<Color>_> * __thiscall
Face::get_layer(vector<Color,_std::allocator<Color>_> *__return_storage_ptr__,Face *this,
               Corner corner,int layer)

{
  iterator __position;
  iterator iVar1;
  int iVar2;
  int iVar3;
  Position to_access;
  key_type local_34;
  
  (__return_storage_ptr__->super__Vector_base<Color,_std::allocator<Color>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Color,_std::allocator<Color>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Color,_std::allocator<Color>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (-1 < layer) {
    iVar2 = layer * 2;
    iVar3 = 0;
    if (iVar2 < 1) {
      iVar2 = 0;
    }
    local_34.reference_corner = corner;
    local_34.layer = layer;
    do {
      local_34.entry = iVar3;
      iVar1 = std::
              _Rb_tree<Position,_std::pair<const_Position,_Color_*>,_std::_Select1st<std::pair<const_Position,_Color_*>_>,_std::less<Position>,_std::allocator<std::pair<const_Position,_Color_*>_>_>
              ::find(&(this->current_state)._M_t,&local_34);
      __position._M_current =
           (__return_storage_ptr__->super__Vector_base<Color,_std::allocator<Color>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<Color,_std::allocator<Color>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<Color,std::allocator<Color>>::_M_realloc_insert<Color_const&>
                  ((vector<Color,std::allocator<Color>> *)__return_storage_ptr__,__position,
                   &(iVar1._M_node[1]._M_left)->_M_color);
      }
      else {
        *__position._M_current = (iVar1._M_node[1]._M_left)->_M_color;
        (__return_storage_ptr__->super__Vector_base<Color,_std::allocator<Color>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      iVar3 = iVar3 + 1;
    } while (iVar2 + 1 != iVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Color> Face::get_layer(Corner corner, int layer){
    std::vector<Color> desired_layer;
    Position to_access;
    to_access.layer =  layer;
    to_access.reference_corner = corner;
    for(int entry = 0; entry < 2*layer + 1; entry++){
        to_access.entry = entry;
        desired_layer.push_back(*current_state.find(to_access)->second);
    }
    return desired_layer;
}